

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall
wabt::SimdStoreLaneExpr::SimdStoreLaneExpr
          (SimdStoreLaneExpr *this,Opcode opcode,Var *memidx,Address align,Address offset,
          uint64_t val,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  Var local_78;
  
  Var::Var(&local_78,memidx);
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.
  super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.
  super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__Expr_001687d0;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.loc.
  filename._M_len = (loc->filename)._M_len;
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.loc.
  filename._M_str = pcVar1;
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.loc.
  field_1.field_1.offset = sVar2;
  *(undefined8 *)
   ((long)&(this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.
           super_Expr.loc.field_1 + 8) = uVar3;
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.type_
       = SimdStoreLane;
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__MemoryExpr_00169c80;
  Var::Var(&(this->super_MemoryExpr<(wabt::ExprType)45>).memidx,&local_78);
  Var::~Var(&local_78);
  (this->super_MemoryExpr<(wabt::ExprType)45>).super_ExprMixin<(wabt::ExprType)45>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__MemoryExpr_00169c18;
  (this->opcode).enum_ = opcode.enum_;
  this->align = align;
  this->offset = offset;
  this->val = val;
  return;
}

Assistant:

SimdStoreLaneExpr(Opcode opcode,
                    Var memidx,
                    Address align,
                    Address offset,
                    uint64_t val,
                    const Location& loc = Location())
      : MemoryExpr<ExprType::SimdStoreLane>(memidx, loc),
        opcode(opcode),
        align(align),
        offset(offset),
        val(val) {}